

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O1

JL_STATUS DetectNewType(char *JsonString,size_t JsonStringLength,size_t StringIndex,_Bool IsJson5,
                       size_t *pNewStringIndex,JL_DATA_TYPE *pNewType,size_t *pErrorAtPos)

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  JL_STATUS JVar8;
  size_t sVar9;
  JL_DATA_TYPE JVar10;
  char cVar11;
  
  *pNewStringIndex = StringIndex;
  *pNewType = JL_DATA_TYPE_NONE;
  JVar8 = JL_STATUS_END_OF_DATA;
  if (StringIndex < JsonStringLength) {
    bVar4 = false;
    bVar5 = false;
    JVar8 = JL_STATUS_END_OF_DATA;
    do {
      bVar2 = JsonString[StringIndex + 1];
      cVar11 = '\0';
      if (bVar2 != 0) {
        cVar11 = JsonString[StringIndex + 2];
      }
      bVar3 = JsonString[StringIndex];
      bVar7 = true;
      sVar9 = StringIndex;
      if ((bVar4) && (bVar3 == 10)) {
        bVar4 = false;
      }
      else {
        sVar1 = StringIndex + 1;
        if ((bVar5) && ((bVar3 == 0x2a && (bVar2 == 0x2f)))) {
          bVar5 = false;
          sVar9 = sVar1;
        }
        else if (!(bool)(bVar5 | bVar4)) {
          switch(bVar3) {
          case 9:
          case 10:
          case 0xd:
            break;
          case 0xb:
          case 0xc:
            if (!IsJson5) {
LAB_00103f61:
              if (((!IsJson5) || (bVar3 != 0xc2)) || (sVar9 = sVar1, bVar2 != 0xa0)) {
                if (((IsJson5) && (bVar3 == 0xef)) && ((bVar2 == 0xbb && (cVar11 == -0x41)))) {
                  sVar9 = StringIndex + 2;
                }
                else {
                  if (bVar3 == 0x22) {
                    JVar10 = JL_DATA_TYPE_STRING;
LAB_00103fe4:
                    bVar6 = false;
                  }
                  else {
                    if (bVar3 == 0x7b) {
                      JVar10 = JL_DATA_TYPE_DICTIONARY;
                      goto LAB_00103fe4;
                    }
                    if (bVar3 == 0x5b) {
                      JVar10 = JL_DATA_TYPE_LIST;
                      goto LAB_00103fe4;
                    }
                    JVar10 = JL_DATA_TYPE_STRING;
                    if ((IsJson5) && (bVar3 == 0x27)) goto LAB_00103fe4;
                    bVar6 = false;
                    if ((bVar3 == 0x66) || (bVar3 == 0x74)) {
                      JVar10 = JL_DATA_TYPE_BOOL;
                    }
                    else {
                      if ((!IsJson5 || bVar3 != 0x2b && bVar3 != 0x2e) &&
                          (bVar3 != 0x2d && 9 < (byte)(bVar3 - 0x30))) {
                        if (IsJson5) {
                          if ((((bVar3 & 0xdf) == 0x49) && ((bVar2 & 0xdf) == 0x4e)) ||
                             (((bVar3 & 0xdf) == 0x4e && ((bVar2 & 0xdf) == 0x41))))
                          goto LAB_00104064;
                        }
                        if (bVar3 != 0x6e) {
                          if ((bVar3 != 0x2f || !IsJson5) || (bVar7 = true, bVar2 != 0x2f)) {
                            bVar7 = true;
                            if ((bVar3 != 0x2f || !IsJson5) || bVar2 != 0x2a) {
                              JVar8 = JL_STATUS_INVALID_DATA;
                              JVar10 = JL_DATA_TYPE_NONE;
                              bVar6 = true;
                              if (pErrorAtPos != (size_t *)0x0) {
                                *pErrorAtPos = StringIndex;
                              }
                              goto LAB_00103fe7;
                            }
                            bVar5 = true;
                            sVar9 = sVar1;
                          }
                          else {
                            bVar4 = true;
                            sVar9 = sVar1;
                          }
                          break;
                        }
                        goto LAB_00103fe4;
                      }
LAB_00104064:
                      bVar6 = false;
                      JVar10 = JL_DATA_TYPE_NUMBER;
                    }
                  }
LAB_00103fe7:
                  bVar7 = false;
                  sVar9 = StringIndex;
                  if (!bVar6) {
                    *pNewStringIndex = StringIndex;
                    *pNewType = JVar10;
                    JVar8 = JL_STATUS_SUCCESS;
                  }
                }
              }
            }
            break;
          default:
            if (bVar3 != 0x20) goto LAB_00103f61;
          }
        }
      }
    } while ((bVar7) && (StringIndex = sVar9 + 1, StringIndex < JsonStringLength));
  }
  return JVar8;
}

Assistant:

static
JL_STATUS
    DetectNewType
    (
        char const*     JsonString,
        size_t          JsonStringLength,
        size_t          StringIndex,
        bool            IsJson5,
        size_t*         pNewStringIndex,
        JL_DATA_TYPE*   pNewType,
        size_t*         pErrorAtPos
    )
{
    JL_STATUS jlStatus;
    bool inSingleLineComment = false;
    bool inMultiLineComment = false;

    *pNewStringIndex = StringIndex;
    *pNewType = JL_DATA_TYPE_NONE;

    jlStatus = JL_STATUS_END_OF_DATA;
    for( size_t i=StringIndex; i<JsonStringLength; i++ )
    {
        JL_DATA_TYPE newType = JL_DATA_TYPE_NONE;
        char currentChar = JsonString[i];
        char nextChar = JsonString[i+1];
        char nextNextChar = 0 != nextChar ? JsonString[i+2] : 0;

        // See if currently in a comment and if this is the end of comment.
        if( inSingleLineComment && '\n' == currentChar )
        {
            inSingleLineComment = false;
            continue;
        }
        else if( inMultiLineComment && '*' == currentChar && '/' == nextChar )
        {
            inMultiLineComment = false;
            i += 1; // Skip the second character in end of comment marker
            continue;
        }
        else if( inSingleLineComment || inMultiLineComment )
        {
            continue;
        }

        if(     ' '  == currentChar
            ||  '\n' == currentChar
            ||  '\r' == currentChar
            ||  '\t' == currentChar
            ||  ( '\f' == currentChar && IsJson5 )
            ||  ( '\v' == currentChar && IsJson5 ) )
        {
            // Whitespace
            continue;
        }
        else if( IsJson5 && '\xc2' == currentChar && '\xa0' == nextChar )
        {
            // Non-breaking space allowed by json5
            i += 1;
            continue;
        }
        else if(    IsJson5
                 && (   ( '\xe2' == currentChar && '\x80' == nextChar && '\xa8' == nextNextChar )        // Line separator
                     || ( '\xe2' == currentChar && '\x80' == nextChar && '\xa9' == nextNextChar )        // Paragraph separator
                     || ( '\xef' == currentChar && '\xbb' == nextChar && '\xbf' == nextNextChar ) ) )    // Byte order mark
        {
            // Extra white space allowed by json5
            i += 2;
            continue;
        }

        if( '{' == currentChar )
        {
            newType = JL_DATA_TYPE_DICTIONARY;
        }
        else if( '[' == currentChar )
        {
            newType = JL_DATA_TYPE_LIST;
        }
        else if( '\"' == currentChar )
        {
            newType = JL_DATA_TYPE_STRING;
        }
        else if( IsJson5 && '\'' == currentChar )
        {
            newType = JL_DATA_TYPE_STRING;
        }
        else if(    'f' == currentChar
                 || 't' == currentChar )
        {
            newType = JL_DATA_TYPE_BOOL;
        }
        else if(    ( currentChar >= '0' && currentChar <= '9' )
                 || '-' == currentChar
                 || ( '.' == currentChar && IsJson5 )
                 || ( '+' == currentChar && IsJson5 )
                 )
        {
            newType = JL_DATA_TYPE_NUMBER;
        }
        else if(    IsJson5
                 && (
                        ( ( 'i' == currentChar || 'I' == currentChar ) && ( 'n' == nextChar || 'N' == nextChar ) )
                     || ( ( 'n' == currentChar || 'N' == currentChar ) && ( 'a' == nextChar || 'A' == nextChar ) ) ) )
        {
            // Allow for "inf" or "nan" for json5
            newType = JL_DATA_TYPE_NUMBER;
        }
        else if( 'n' == currentChar )
        {
            // If NULL type then we will just treat as a string as we have NULL strings. tyle
            newType = JL_DATA_TYPE_STRING;
        }
        else if( IsJson5 && '/' == currentChar && '/' == nextChar )
        {
            // Single line comment
            i += 1; // Skip the second character in comment marker
            inSingleLineComment = true;
            continue;
        }
        else if( IsJson5 && '/' == currentChar && '*' == nextChar )
        {
            // Multi line comment
            i += 1; // Skip the second character in comment marker
            inMultiLineComment = true;
            continue;
        }
        else
        {
            // Unexpected character at this time.
            jlStatus = JL_STATUS_INVALID_DATA;
            if( NULL != pErrorAtPos )
            {
                *pErrorAtPos = i;
            }
        }

        if( JL_DATA_TYPE_NONE != newType )
        {
            *pNewStringIndex = i;
            *pNewType = newType;
            jlStatus = JL_STATUS_SUCCESS;
        }

        break;
    }

    return jlStatus;
}